

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O1

void __thiscall
slang::IntervalMap<unsigned_long,_std::monostate,_0U>::overlap_iterator::unionWith
          (overlap_iterator *this,monostate *value,allocator_type *alloc)

{
  Path *other;
  interval<unsigned_long> *key;
  Path *this_00;
  uint32_t *puVar1;
  IntervalMap<unsigned_long,_std::monostate,_0U> *pIVar2;
  pointer pEVar3;
  size_type sVar4;
  void *pvVar5;
  IntervalMap<unsigned_long,_std::monostate,_0U> *pIVar6;
  ulong *puVar7;
  overlap_iterator *poVar8;
  ulong uVar9;
  uint uVar10;
  unsigned_long *puVar11;
  long lVar12;
  overlap_iterator *poVar13;
  unsigned_long uVar14;
  BranchNode<unsigned_long,_8U,_true> *self;
  overlap_iterator *poVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  bool bVar19;
  iterator nextIt;
  iterator local_70;
  
  pIVar2 = (this->super_iterator).super_const_iterator.map;
  uVar10 = pIVar2->rootSize;
  if (pIVar2->height == 0) {
    if (uVar10 != 0) {
      uVar9 = (this->searchKey).left;
      puVar11 = &(pIVar2->field_0).rootLeaf.
                 super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_11U>
                 .first[0].right;
      poVar13 = (overlap_iterator *)0x0;
      poVar15 = this;
      do {
        if (((interval<unsigned_long> *)(puVar11 + -1))->left < uVar9) {
          bVar19 = *puVar11 + 1 < uVar9;
          poVar8 = poVar15;
          if (!bVar19) {
            poVar8 = poVar13;
          }
        }
        else {
          bVar19 = false;
          poVar8 = poVar13;
        }
        poVar15 = (overlap_iterator *)((ulong)poVar8 & 0xffffffff);
        if (!bVar19) {
          uVar10 = (uint)poVar8;
          break;
        }
        poVar13 = (overlap_iterator *)
                  ((long)&(poVar13->super_iterator).super_const_iterator.map + 1);
        puVar11 = puVar11 + 2;
      } while ((overlap_iterator *)(ulong)uVar10 != poVar13);
    }
    const_iterator::setRoot((const_iterator *)this,uVar10);
  }
  else {
    if (uVar10 != 0) {
      uVar9 = (this->searchKey).left;
      puVar11 = (unsigned_long *)
                ((long)((pIVar2->field_0).rootLeaf.
                        super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_11U>
                        .first + 4) + 8);
      poVar13 = (overlap_iterator *)0x0;
      poVar15 = this;
      do {
        if (((interval<unsigned_long> *)(puVar11 + -1))->left < uVar9) {
          bVar19 = *puVar11 + 1 < uVar9;
          poVar8 = poVar15;
          if (!bVar19) {
            poVar8 = poVar13;
          }
        }
        else {
          bVar19 = false;
          poVar8 = poVar13;
        }
        poVar15 = (overlap_iterator *)((ulong)poVar8 & 0xffffffff);
        if (!bVar19) {
          uVar10 = (uint)poVar8;
          break;
        }
        poVar13 = (overlap_iterator *)
                  ((long)&(poVar13->super_iterator).super_const_iterator.map + 1);
        puVar11 = puVar11 + 2;
      } while ((overlap_iterator *)(ulong)uVar10 != poVar13);
    }
    const_iterator::setRoot((const_iterator *)this,uVar10);
    treeFindUnion(this);
  }
  if (((this->super_iterator).super_const_iterator.path.path.
       super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len == 0) ||
     (other = &(this->super_iterator).super_const_iterator.path,
     pEVar3 = (other->path).super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_,
     pEVar3->size <= pEVar3->offset)) {
    iterator::insert(&this->super_iterator,(this->searchKey).left,(this->searchKey).right,value,
                     alloc);
    return;
  }
  pEVar3 = (this->super_iterator).super_const_iterator.path.path.
           super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
  sVar4 = (this->super_iterator).super_const_iterator.path.path.
          super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len;
  lVar12 = (ulong)pEVar3[sVar4 - 1].offset * 0x10;
  key = &this->searchKey;
  uVar9 = (this->searchKey).left;
  uVar14 = (this->searchKey).right;
  if ((*(long *)((long)pEVar3[sVar4 - 1].node + lVar12 + 8) + 1U < uVar9) ||
     (uVar14 + 1 < *(ulong *)((long)pEVar3[sVar4 - 1].node + lVar12))) {
    iterator::insert(&this->super_iterator,uVar9,uVar14,value,alloc);
  }
  else {
    pvVar5 = pEVar3[sVar4 - 1].node;
    uVar16 = *(ulong *)((long)pvVar5 + lVar12 + 8);
    uVar17 = *(ulong *)((long)pvVar5 + lVar12);
    if (uVar9 < *(ulong *)((long)pvVar5 + lVar12)) {
      uVar17 = uVar9;
    }
    *(ulong *)((long)pvVar5 + lVar12) = uVar17;
    if (uVar14 < uVar16) {
      uVar14 = uVar16;
    }
    *(unsigned_long *)((long)pvVar5 + lVar12 + 8) = uVar14;
    uVar14 = ((unsigned_long *)((long)pvVar5 + lVar12))[1];
    key->left = *(unsigned_long *)((long)pvVar5 + lVar12);
    (this->searchKey).right = uVar14;
    iterator::updateParentBounds(&this->super_iterator,(int)sVar4 - 1,key);
  }
  this_00 = &local_70.super_const_iterator.path;
LAB_0043c712:
  do {
    pIVar6 = (this->super_iterator).super_const_iterator.map;
    pEVar3 = (this->super_iterator).super_const_iterator.path.path.
             super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
    sVar4 = (this->super_iterator).super_const_iterator.path.path.
            super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len;
    uVar10 = pEVar3[sVar4 - 1].offset + 1;
    if (uVar10 < pEVar3[sVar4 - 1].size) {
      pvVar5 = pEVar3[sVar4 - 1].node;
      if (*(ulong *)((long)pvVar5 + (ulong)uVar10 * 0x10) <= (this->searchKey).right + 1) {
        lVar12 = (ulong)uVar10 * 0x10;
        uVar9 = *(ulong *)((long)pvVar5 + lVar12);
        uVar16 = *(ulong *)((long)pvVar5 + lVar12 + 8);
        pvVar5 = pEVar3[sVar4 - 1].node;
        lVar12 = (ulong)pEVar3[sVar4 - 1].offset * 0x10;
        uVar17 = *(ulong *)((long)pvVar5 + lVar12 + 8);
        uVar18 = *(ulong *)((long)pvVar5 + lVar12);
        if (uVar9 < *(ulong *)((long)pvVar5 + lVar12)) {
          uVar18 = uVar9;
        }
        *(ulong *)((long)pvVar5 + lVar12) = uVar18;
        if (uVar16 < uVar17) {
          uVar16 = uVar17;
        }
        *(ulong *)((long)pvVar5 + lVar12 + 8) = uVar16;
        uVar14 = ((unsigned_long *)((long)pvVar5 + lVar12))[1];
        key->left = *(unsigned_long *)((long)pvVar5 + lVar12);
        (this->searchKey).right = uVar14;
        pEVar3[sVar4 - 1].offset = uVar10;
        iterator::erase(&this->super_iterator,alloc,false);
        puVar1 = &(this->super_iterator).super_const_iterator.path.path.
                  super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_
                  [(this->super_iterator).super_const_iterator.path.path.
                   super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len - 1].offset;
        *puVar1 = *puVar1 - 1;
        goto LAB_0043c712;
      }
    }
    if (pIVar6->height == 0) {
      return;
    }
    if (uVar10 != pEVar3[sVar4 - 1].size) {
      return;
    }
    local_70.super_const_iterator.map = pIVar6;
    SmallVector<slang::IntervalMapDetails::Path::Entry,_2UL>::SmallVector
              (&this_00->path,(Base *)other);
    IntervalMapDetails::Path::moveRight(this_00,pIVar2->height);
    if ((((local_70.super_const_iterator.path.path.
           super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len == 0) ||
         ((local_70.super_const_iterator.path.path.
           super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_)->size <=
          (local_70.super_const_iterator.path.path.
           super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_)->offset)) ||
        (local_70.super_const_iterator.path.path.
         super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_
         [local_70.super_const_iterator.path.path.
          super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len - 1].size == 0)) ||
       (puVar7 = (ulong *)local_70.super_const_iterator.path.path.
                          super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_
                          [local_70.super_const_iterator.path.path.
                           super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len - 1].
                          node, (this->searchKey).right + 1 < *puVar7)) {
      if (local_70.super_const_iterator.path.path.
          super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_ !=
          (pointer)local_70.super_const_iterator.path.path.
                   super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.firstElement) {
        operator_delete(local_70.super_const_iterator.path.path.
                        super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_);
      }
      return;
    }
    uVar9 = puVar7[1];
    pEVar3 = (this->super_iterator).super_const_iterator.path.path.
             super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
    sVar4 = (this->super_iterator).super_const_iterator.path.path.
            super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len;
    pvVar5 = pEVar3[sVar4 - 1].node;
    lVar12 = (ulong)pEVar3[sVar4 - 1].offset * 0x10;
    uVar16 = *(ulong *)((long)pvVar5 + lVar12 + 8);
    uVar17 = *(ulong *)((long)pvVar5 + lVar12);
    if (*puVar7 < *(ulong *)((long)pvVar5 + lVar12)) {
      uVar17 = *puVar7;
    }
    *(ulong *)((long)pvVar5 + lVar12) = uVar17;
    if (uVar9 < uVar16) {
      uVar9 = uVar16;
    }
    *(ulong *)((long)pvVar5 + lVar12 + 8) = uVar9;
    uVar14 = ((unsigned_long *)((long)pvVar5 + lVar12))[1];
    key->left = *(unsigned_long *)((long)pvVar5 + lVar12);
    (this->searchKey).right = uVar14;
    iterator::updateParentBounds(&this->super_iterator,(int)sVar4 - 1,key);
    bVar19 = iterator::erase(&local_70,alloc,true);
    if (bVar19) {
      SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::operator=
                ((SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *)other,
                 (SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *)this_00);
      IntervalMapDetails::Path::moveLeft(other,pIVar2->height);
    }
    if (local_70.super_const_iterator.path.path.
        super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_ !=
        (pointer)local_70.super_const_iterator.path.path.
                 super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.firstElement) {
      operator_delete(local_70.super_const_iterator.path.path.
                      super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_);
    }
  } while( true );
}

Assistant:

void IntervalMap<TKey, TValue, N>::overlap_iterator::unionWith(const TValue& value,
                                                               allocator_type& alloc) {
    using namespace IntervalMapDetails;

    auto& map = *this->map;
    auto& path = this->path;
    if (this->isFlat()) {
        this->setRoot(map.rootLeaf.findUnionLeft(0, map.rootSize, searchKey));
    }
    else {
        this->setRoot(map.rootBranch.findUnionLeft(0, map.rootSize, searchKey));
        treeFindUnion();
    }

    // The iterator now points to one of the following:
    // - The first existing interval that overlaps (or is adjacent to) the search key
    // - The correct place to insert the search key as a new interval
    // - The end of the map (also the correct place to insert)
    if (!valid()) {
        // We're at the end of the map so just insert and we're done.
        this->insert(searchKey.left, searchKey.right, value, alloc);
        return;
    }

    auto getCurrKey = [&]() -> interval<TKey>& {
        auto offset = path.leafOffset();
        return this->isFlat() ? path.template leaf<RootLeaf>().keyAt(offset)
                              : path.template leaf<Leaf>().keyAt(offset);
    };

    auto updateCurrKey = [&](interval<TKey> newKey) {
        // Expand the current entry to match our new item.
        auto& currKey = getCurrKey();
        currKey.unionWith(newKey);
        searchKey = currKey;
    };

    if (!getCurrKey().overlapsOrAdjacent(searchKey)) {
        this->insert(searchKey.left, searchKey.right, value, alloc);
    }
    else {
        // Otherwise expand the current entry to match our new item.
        updateCurrKey(searchKey);
        this->updateParentBounds(path.height(), searchKey);
    }

    // Our new interval is inserted or updated. Continue forward and
    // merge all later intervals that overlap with this one.
    while (true) {
        uint32_t offset = path.leafOffset() + 1;
        bool canUnionRight;
        interval<TKey> currKey;
        if (this->isFlat()) {
            auto& leaf = path.template leaf<RootLeaf>();
            canUnionRight = leaf.canUnionRight(offset, path.leafSize(), searchKey);
            currKey = leaf.keyAt(offset);
        }
        else {
            auto& leaf = path.template leaf<Leaf>();
            canUnionRight = leaf.canUnionRight(offset, path.leafSize(), searchKey);
            currKey = leaf.keyAt(offset);
        }

        if (canUnionRight) {
            // This does not change our parent bounds so no need to update.
            updateCurrKey(currKey);

            path.leafOffset() = offset;
            bool modifiedPath = this->erase(alloc, false);
            SLANG_ASSERT(!modifiedPath);

            path.leafOffset()--;
        }
        else if (offset == path.leafSize() && !this->isFlat()) {
            // Copy our iterator and advance to the next node to see if we can merge
            // with it. This intentionally slices the object since we don't need the
            // wider overlapped_iterator here.
            iterator nextIt = *this;
            nextIt.path.moveRight(map.height);
            if (!nextIt.valid() || !nextIt.path.template leaf<Leaf>().canUnionRight(
                                       0, nextIt.path.leafSize(), searchKey)) {
                // Nope, we're done.
                return;
            }

            // Merge and erase the next elem.
            updateCurrKey(nextIt.path.template leaf<Leaf>().keyAt(0));
            this->updateParentBounds(path.height(), searchKey);

            if (nextIt.erase(alloc, true)) {
                // The erase operation deleted nodes so our path is invalid.
                // Get back to a good state by copying from the nextIt's path
                // and then moving back left.
                path = nextIt.path;
                path.moveLeft(map.height);
            }
        }
        else {
            return;
        }
    }
}